

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_RECALL(effect_handler_context_t_conflict *context)

{
  int16_t *piVar1;
  _Bool _Var2;
  wchar_t level;
  uint32_t uVar3;
  wchar_t target_depth;
  effect_handler_context_t_conflict *context_local;
  
  context->ident = true;
  if ((((player->opts).opt[0x21] & 1U) == 0) || (player->total_winner != 0)) {
    if ((((player->opts).opt[0x20] & 1U) == 0) ||
       (_Var2 = is_quest(player,(int)player->depth), !_Var2)) {
      if ((player->upkeep->arena_level & 1U) == 0) {
        level = dungeon_get_next_level(player,(int)player->max_depth,L'\x01');
        if ((((((player->opts).opt[0x20] & 1U) == 0) || (player->depth != 0)) ||
            (_Var2 = is_quest(player,level), !_Var2)) ||
           (_Var2 = get_check("Are you sure you want to descend? "), _Var2)) {
          if (player->word_recall == 0) {
            if (player->depth < 1) {
              if ((((player->opts).opt[0x2b] & 1U) != 0) &&
                 (_Var2 = player_get_recall_depth(player), !_Var2)) {
                return false;
              }
            }
            else if ((player->depth == player->max_depth) || (((player->opts).opt[0x2b] & 1U) != 0))
            {
              player->recall_depth = player->max_depth;
            }
            else {
              _Var2 = get_check("Set recall depth to current depth? ");
              if (_Var2) {
                piVar1 = &player->depth;
                player->max_depth = *piVar1;
                player->recall_depth = *piVar1;
              }
            }
            uVar3 = Rand_div(0x14);
            player->word_recall = (short)uVar3 + 0xf;
            msg("The air about you becomes charged...");
          }
          else {
            _Var2 = get_check("Word of Recall is already active.  Do you want to cancel it? ");
            if (!_Var2) {
              return false;
            }
            player->word_recall = 0;
            msg("A tension leaves the air around you...");
          }
          player->upkeep->redraw = player->upkeep->redraw | 0x2000;
          handle_stuff(player);
          context_local._7_1_ = true;
        }
        else {
          context_local._7_1_ = false;
        }
      }
      else {
        msg("Nothing happens.");
        context_local._7_1_ = true;
      }
    }
    else {
      msg("Nothing happens.");
      context_local._7_1_ = true;
    }
  }
  else {
    msg("Nothing happens.");
    context_local._7_1_ = true;
  }
  return context_local._7_1_;
}

Assistant:

bool effect_handler_RECALL(effect_handler_context_t *context)
{
	int target_depth;
	context->ident = true;

	/* No recall */
	if (OPT(player, birth_no_recall) && !player->total_winner) {
		msg("Nothing happens.");
		return true;
	}

	/* No recall from quest levels with force_descend */
	if (OPT(player, birth_force_descend)
			&& is_quest(player, player->depth)) {
		msg("Nothing happens.");
		return true;
	}

	/* No recall from single combat */
	if (player->upkeep->arena_level) {
		msg("Nothing happens.");
		return true;
	}

	/* Warn the player if they're descending to an unrecallable level */
	target_depth = dungeon_get_next_level(player, player->max_depth, 1);
	if (OPT(player, birth_force_descend) && !(player->depth)
			&& is_quest(player, target_depth)) {
		if (!get_check("Are you sure you want to descend? ")) {
			return false;
		}
	}

	/* Activate recall */
	if (!player->word_recall) {
		/* Reset recall depth */
		if (player->depth > 0) {
			if (player->depth != player->max_depth
					&& !OPT(player, birth_levels_persist)) {
				if (get_check("Set recall depth to current depth? ")) {
					player->recall_depth = player->max_depth = player->depth;
				}
			} else {
				player->recall_depth = player->max_depth;
			}
		} else {
			if (OPT(player, birth_levels_persist)) {
				/* Persistent levels players get to choose */
				if (!player_get_recall_depth(player)) return false;
			}
		}

		player->word_recall = randint0(20) + 15;
		msg("The air about you becomes charged...");
	} else {
		/* Deactivate recall */
		if (!get_check("Word of Recall is already active.  Do you want to cancel it? "))
			return false;

		player->word_recall = 0;
		msg("A tension leaves the air around you...");
	}

	/* Redraw status line */
	player->upkeep->redraw |= PR_STATUS;
	handle_stuff(player);

	return true;
}